

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_reader.cpp
# Opt level: O3

bool __thiscall diffusion::Tokenizer::is_empty(Tokenizer *this)

{
  _Elt_pointer pvVar1;
  _Elt_pointer pvVar2;
  pointer pcVar3;
  undefined1 extraout_AL;
  undefined1 uVar4;
  uint uVar5;
  size_t in_RSI;
  _Vector_base<char,_std::allocator<char>_> *this_00;
  pointer __s;
  void *pvVar6;
  
  uVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->queue_mutex_);
  if (uVar5 == 0) {
    pvVar1 = (this->processed_data_queue_).
             super__Deque_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    pvVar2 = (this->processed_data_queue_).
             super__Deque_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    pthread_mutex_unlock((pthread_mutex_t *)&this->queue_mutex_);
    return pvVar1 == pvVar2;
  }
  this_00 = (_Vector_base<char,_std::allocator<char>_> *)(ulong)uVar5;
  std::__throw_system_error(uVar5);
  if ((long)in_RSI < 0) {
    std::__throw_length_error("cannot create std::vector larger than max_size()");
  }
  (this_00->_M_impl).super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->_M_impl).super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->_M_impl).super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<char,_std::allocator<char>_>::_M_create_storage(this_00,in_RSI);
  pcVar3 = (this_00->_M_impl).super__Vector_impl_data._M_start;
  __s = pcVar3;
  uVar4 = extraout_AL;
  if (in_RSI != 0) {
    *pcVar3 = '\0';
    __s = pcVar3 + 1;
    if (in_RSI - 1 != 0) {
      pvVar6 = memset(__s,0,in_RSI - 1);
      uVar4 = SUB81(pvVar6,0);
      __s = pcVar3 + in_RSI;
    }
  }
  (this_00->_M_impl).super__Vector_impl_data._M_finish = __s;
  return (bool)uVar4;
}

Assistant:

bool is_empty() const {
        std::lock_guard<std::mutex> lock(queue_mutex_);
        return processed_data_queue_.empty();
    }